

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::OP_ProfiledCallAsmInternal
          (InterpreterStackFrame *this,RegSlot funcReg,RegSlot returnReg,ProfileId profileId)

{
  ScriptFunction *function;
  FunctionBody *calleeBody;
  DynamicProfileInfo *this_00;
  
  function = (ScriptFunction *)
             JavascriptOperators::GetCallableObjectOrThrow
                       (*(Var *)(*(long *)(this + 0x120) + (ulong)funcReg * 8),
                        *(ScriptContext **)(this + 0x78));
  calleeBody = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  this_00 = FunctionBody::GetDynamicProfileInfo(*(FunctionBody **)(this + 0x88));
  DynamicProfileInfo::RecordAsmJsCallSiteInfo
            (this_00,*(FunctionBody **)(this + 0x88),profileId,calleeBody);
  OP_CallAsmInternalCommon(this,function,returnReg);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfiledCallAsmInternal(RegSlot funcReg, RegSlot returnReg, ProfileId profileId)
    {
        Var target = GetRegRawPtr(funcReg);
        ScriptFunction* function = (ScriptFunction*)OP_CallGetFunc(target);

        Js::FunctionBody * body = function->GetFunctionBody();
        DynamicProfileInfo * dynamicProfileInfo = GetFunctionBody()->GetDynamicProfileInfo();
        dynamicProfileInfo->RecordAsmJsCallSiteInfo(GetFunctionBody(), profileId, body);
        return OP_CallAsmInternalCommon(function, returnReg);
    }